

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O0

void * aom_memalign(size_t align,size_t size)

{
  int iVar1;
  size_t sVar2;
  void *mem;
  void *in_RSI;
  size_t in_RDI;
  void *addr;
  size_t aligned_size;
  void *x;
  size_t in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  local_8 = (void *)0x0;
  iVar1 = check_size_argument_overflow((size_t)in_RSI,0,in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    sVar2 = GetAllocationPaddingSize(in_RDI);
    mem = malloc((long)in_RSI + sVar2);
    if (mem != (void *)0x0) {
      local_8 = (void *)((long)mem + in_RDI + 7 & (in_RDI - 1 ^ 0xffffffffffffffff));
      SetActualMallocAddress(mem,in_RSI);
    }
  }
  return local_8;
}

Assistant:

void *aom_memalign(size_t align, size_t size) {
  void *x = NULL;
  if (!check_size_argument_overflow(1, size, align)) return NULL;
  const size_t aligned_size = size + GetAllocationPaddingSize(align);
  void *const addr = malloc(aligned_size);
  if (addr) {
    x = aom_align_addr((unsigned char *)addr + ADDRESS_STORAGE_SIZE, align);
    SetActualMallocAddress(x, addr);
  }
  return x;
}